

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

bool tinyusdz::LoadUSDFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  string *psVar5;
  string _err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string filepath;
  MMapFileHandle handle;
  string base_dir;
  string local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  Stage *local_b0;
  string local_a8;
  MMapFileHandle local_88;
  string local_50;
  
  io::ExpandFilePath(&local_a8,(string *)_filename,(void *)0x0);
  io::GetBaseDir(&local_50,(string *)_filename);
  bVar2 = io::IsMMapSupported();
  if (bVar2) {
    paVar1 = &local_88.filename.field_2;
    local_88.filename._M_string_length = 0;
    local_88.filename.field_2._M_allocated_capacity =
         local_88.filename.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_88.writable = false;
    local_88.addr = (uint8_t *)0x0;
    local_88.size = 0;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_b0 = stage;
    local_88.filename._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = io::MMapFile(&local_a8,&local_88,false,&local_f0);
    if (bVar2) {
      if (warn != (string *)0x0 && local_f0._M_string_length != 0) {
        local_d0[0] = local_c0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,local_f0._M_dataplus._M_p,
                   local_f0._M_dataplus._M_p + local_f0._M_string_length);
        ::std::__cxx11::string::append((char *)local_d0);
        psVar5 = warn;
LAB_0011f50d:
        ::std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_d0[0]);
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
      }
    }
    else if (err != (string *)0x0) {
      local_d0[0] = local_c0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,local_f0._M_dataplus._M_p,
                 local_f0._M_dataplus._M_p + local_f0._M_string_length);
      ::std::__cxx11::string::append((char *)local_d0);
      psVar5 = err;
      goto LAB_0011f50d;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      bVar3 = LoadUSDFromMemory(local_88.addr,local_88.size,(string *)&local_a8,local_b0,warn,err,
                                options);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      io::UnmapFile(&local_88,&local_f0);
      if (warn != (string *)0x0 && local_f0._M_string_length != 0) {
        local_d0[0] = local_c0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,local_f0._M_dataplus._M_p,
                   local_f0._M_dataplus._M_p + local_f0._M_string_length);
        ::std::__cxx11::string::append((char *)local_d0);
        ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_d0[0]);
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.filename._M_dataplus._M_p == paVar1) goto LAB_0011f641;
    uVar4 = local_88.filename.field_2._M_allocated_capacity + 1;
  }
  else {
    local_88.filename._M_dataplus._M_p = (pointer)0x0;
    local_88.filename._M_string_length = 0;
    local_88.filename.field_2._M_allocated_capacity = 0;
    bVar3 = false;
    bVar2 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
                              (string *)err,&local_a8,(long)options->max_memory_limit_in_mb << 0x14,
                              (void *)0x0);
    if (bVar2) {
      bVar3 = LoadUSDFromMemory((uint8_t *)local_88.filename._M_dataplus._M_p,
                                local_88.filename._M_string_length -
                                (long)local_88.filename._M_dataplus._M_p,(string *)&local_50,stage,
                                warn,err,options);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.filename._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0011f641;
    uVar4 = local_88.filename.field_2._M_allocated_capacity -
            (long)local_88.filename._M_dataplus._M_p;
  }
  operator_delete(local_88.filename._M_dataplus._M_p,uVar4);
LAB_0011f641:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool LoadUSDFromFile(const std::string &_filename, Stage *stage,
                     std::string *warn, std::string *err,
                     const USDLoadOptions &options) {
  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);
  std::string base_dir = io::GetBaseDir(_filename);

  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;
  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      return false;
    }

    return LoadUSDFromMemory(data.data(), data.size(), base_dir, stage, warn, err,
                             options);
  }
}